

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error doCdataSection(XML_Parser parser,ENCODING *enc,char **startPtr,char *end,char **nextPtr,
                        XML_Bool haveMore)

{
  XML_Parsing XVar1;
  XML_CharacterDataHandler p_Var2;
  XML_DefaultHandler p_Var3;
  bool bVar4;
  int iVar5;
  XML_Convert_Result XVar6;
  XML_Error unaff_EBX;
  undefined3 in_register_00000089;
  undefined4 uVar7;
  char **ppcVar8;
  char *s;
  char *next;
  XML_Char c;
  char *local_70;
  char *local_68;
  OPEN_INTERNAL_ENTITY *local_60;
  XML_Char *local_58;
  char **local_50;
  undefined4 local_44;
  char **local_40;
  char *local_38;
  
  uVar7 = CONCAT31(in_register_00000089,haveMore);
  local_70 = *startPtr;
  if (parser->m_encoding == enc) {
    local_60 = (OPEN_INTERNAL_ENTITY *)&parser->m_eventPtr;
    parser->m_eventPtr = local_70;
    ppcVar8 = &parser->m_eventEndPtr;
  }
  else {
    local_60 = parser->m_openInternalEntities;
    ppcVar8 = &local_60->internalEventEndPtr;
  }
  local_60->internalEventPtr = local_70;
  *startPtr = (char *)0x0;
  local_50 = nextPtr;
  local_40 = startPtr;
  local_38 = end;
  do {
    iVar5 = (*enc->scanners[2])(enc,local_70,local_38,&local_68);
    *ppcVar8 = local_68;
    switch(iVar5) {
    case 0:
      local_60->internalEventPtr = local_68;
      unaff_EBX = XML_ERROR_INVALID_TOKEN;
      break;
    case 6:
      p_Var2 = parser->m_characterDataHandler;
      if (p_Var2 == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
        nextPtr = local_50;
joined_r0x0045dd44:
        if (p_Var3 != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,local_70,local_68);
        }
      }
      else if (enc->isUtf8 == '\0') {
        while( true ) {
          local_44 = uVar7;
          local_58 = parser->m_dataBuf;
          XVar6 = (*enc->utf8Convert)(enc,&local_70,local_68,&local_58,parser->m_dataBufEnd);
          *ppcVar8 = local_68;
          (*p_Var2)(parser->m_handlerArg,parser->m_dataBuf,(int)local_58 - (int)parser->m_dataBuf);
          nextPtr = local_50;
          uVar7 = local_44;
          if (XVar6 < XML_CONVERT_OUTPUT_EXHAUSTED) break;
          local_60->internalEventPtr = local_70;
        }
      }
      else {
        (*p_Var2)(parser->m_handlerArg,local_70,(int)local_68 - (int)local_70);
        nextPtr = local_50;
      }
      goto LAB_0045de1b;
    case 7:
      if (parser->m_characterDataHandler == (XML_CharacterDataHandler)0x0) {
        p_Var3 = parser->m_defaultHandler;
        goto joined_r0x0045dd44;
      }
      local_58 = (XML_Char *)CONCAT71(local_58._1_7_,10);
      (*parser->m_characterDataHandler)(parser->m_handlerArg,(XML_Char *)&local_58,1);
LAB_0045de1b:
      local_70 = local_68;
      local_60->internalEventPtr = local_68;
      XVar1 = (parser->m_parsingStatus).parsing;
      if (XVar1 == XML_FINISHED) {
        unaff_EBX = XML_ERROR_ABORTED;
        break;
      }
      if (XVar1 == XML_SUSPENDED) {
        *nextPtr = local_68;
        bVar4 = false;
        unaff_EBX = XML_ERROR_NONE;
      }
      else {
        bVar4 = true;
      }
      goto LAB_0045de52;
    case -4:
    case -1:
      if ((char)uVar7 == '\0') {
        unaff_EBX = XML_ERROR_UNCLOSED_CDATA_SECTION;
      }
      else {
LAB_0045dcc7:
        unaff_EBX = XML_ERROR_NONE;
        *nextPtr = local_70;
      }
      break;
    case -3:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
switchD_0045dc7b_caseD_fffffffd:
      local_60->internalEventPtr = local_68;
      unaff_EBX = XML_ERROR_UNEXPECTED_STATE;
      break;
    case -2:
      if ((char)uVar7 != '\0') goto LAB_0045dcc7;
      unaff_EBX = XML_ERROR_PARTIAL_CHAR;
      break;
    default:
      if (iVar5 != 0x28) goto switchD_0045dc7b_caseD_fffffffd;
      if (parser->m_endCdataSectionHandler == (XML_EndCdataSectionHandler)0x0) {
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,enc,local_70,local_68);
        }
      }
      else {
        (*parser->m_endCdataSectionHandler)(parser->m_handlerArg);
      }
      *local_40 = local_68;
      *nextPtr = local_68;
      bVar4 = false;
      unaff_EBX = XML_ERROR_NONE;
      if ((parser->m_parsingStatus).parsing == XML_FINISHED) {
        unaff_EBX = XML_ERROR_ABORTED;
      }
      goto LAB_0045de52;
    }
    bVar4 = false;
LAB_0045de52:
    if (!bVar4) {
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

static enum XML_Error
doCdataSection(XML_Parser parser,
               const ENCODING *enc,
               const char **startPtr,
               const char *end,
               const char **nextPtr,
               XML_Bool haveMore)
{
  const char *s = *startPtr;
  const char **eventPP;
  const char **eventEndPP;
  if (enc == parser->m_encoding) {
    eventPP = &parser->m_eventPtr;
    *eventPP = s;
    eventEndPP = &parser->m_eventEndPtr;
  }
  else {
    eventPP = &(parser->m_openInternalEntities->internalEventPtr);
    eventEndPP = &(parser->m_openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  *startPtr = NULL;

  for (;;) {
    const char *next;
    int tok = XmlCdataSectionTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_CDATA_SECT_CLOSE:
      if (parser->m_endCdataSectionHandler)
        parser->m_endCdataSectionHandler(parser->m_handlerArg);
/* BEGIN disabled code */
      /* see comment under XML_TOK_CDATA_SECT_OPEN */
      else if (0 && parser->m_characterDataHandler)
        parser->m_characterDataHandler(parser->m_handlerArg, parser->m_dataBuf, 0);
/* END disabled code */
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      *startPtr = next;
      *nextPtr = next;
      if (parser->m_parsingStatus.parsing == XML_FINISHED)
        return XML_ERROR_ABORTED;
      else
        return XML_ERROR_NONE;
    case XML_TOK_DATA_NEWLINE:
      if (parser->m_characterDataHandler) {
        XML_Char c = 0xA;
        parser->m_characterDataHandler(parser->m_handlerArg, &c, 1);
      }
      else if (parser->m_defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_DATA_CHARS:
      {
        XML_CharacterDataHandler charDataHandler = parser->m_characterDataHandler;
        if (charDataHandler) {
          if (MUST_CONVERT(enc, s)) {
            for (;;) {
              ICHAR *dataPtr = (ICHAR *)parser->m_dataBuf;
              const enum XML_Convert_Result convert_res = XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)parser->m_dataBufEnd);
              *eventEndPP = next;
              charDataHandler(parser->m_handlerArg, parser->m_dataBuf,
                              (int)(dataPtr - (ICHAR *)parser->m_dataBuf));
              if ((convert_res == XML_CONVERT_COMPLETED) || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
                break;
              *eventPP = s;
            }
          }
          else
            charDataHandler(parser->m_handlerArg,
                            (XML_Char *)s,
                            (int)((XML_Char *)next - (XML_Char *)s));
        }
        else if (parser->m_defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_PARTIAL:
    case XML_TOK_NONE:
      if (haveMore) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_CDATA_SECTION;
    default:
      /* Every token returned by XmlCdataSectionTok() has its own
       * explicit case, so this default case will never be executed.
       * We retain it as a safety net and exclude it from the coverage
       * statistics.
       *
       * LCOV_EXCL_START
      */
      *eventPP = next;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }

    *eventPP = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
  /* not reached */
}